

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvnc.cpp
# Opt level: O2

ssize_t __thiscall QVncClientCursor::write(QVncClientCursor *this,int __fd,void *__buf,size_t __n)

{
  ushort uVar1;
  char cVar2;
  ushort uVar3;
  undefined4 uVar4;
  int iVar5;
  int screendepth;
  int iVar6;
  QTcpSocket *pQVar7;
  char *dst;
  char *src;
  longlong lVar8;
  int i;
  int iVar9;
  undefined4 in_register_00000034;
  QVncClient *this_00;
  long in_FS_OFFSET;
  QImage local_90 [24];
  qint32 encoding;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  long local_38;
  
  this_00 = (QVncClient *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = QVncClient::clientSocket(this_00);
  local_58 = 0x1000000;
  uVar3 = (ushort)(this->hotspot).xp.m_i;
  uVar1 = (ushort)(this->hotspot).yp.m_i;
  uStack_54 = CONCAT22(uVar1 << 8 | uVar1 >> 8,uVar3 << 8 | uVar3 >> 8);
  uVar3 = QImage::width();
  uStack_50 = CONCAT22(uStack_50._2_2_,uVar3 << 8 | uVar3 >> 8);
  uVar3 = QImage::height();
  uStack_50 = CONCAT22(uVar3 << 8 | uVar3 >> 8,(undefined2)uStack_50);
  QIODevice::write((char *)pQVar7,(longlong)&local_58);
  encoding = 0x11ffffff;
  QIODevice::write((char *)pQVar7,(longlong)&encoding);
  cVar2 = QImage::isNull();
  if (cVar2 == '\0') {
    local_48 = 0xaaaaaaaaaaaaaaaa;
    local_58 = 0xaaaaaaaa;
    uStack_54 = 0xaaaaaaaa;
    uStack_50 = 0xaaaaaaaa;
    uStack_4c = 0xaaaaaaaa;
    uVar4 = (**(code **)(**(long **)(*(long *)(this_00 + 0x10) + 0x30) + 0x78))();
    iVar9 = 0;
    QImage::convertToFormat_helper(&local_58,&this->cursor,uVar4,0);
    iVar6 = *(int *)(this_00 + 0x30);
    iVar5 = QImage::width();
    screendepth = QImage::depth();
    dst = (char *)operator_new__((long)(iVar5 * (iVar6 / 8)));
    while( true ) {
      iVar6 = QImage::height();
      if (iVar6 <= iVar9) break;
      src = (char *)QImage::scanLine((int)&local_58);
      iVar6 = QImage::width();
      QVncClient::convertPixels(this_00,dst,src,iVar6,screendepth);
      QIODevice::write((char *)pQVar7,(longlong)dst);
      iVar9 = iVar9 + 1;
    }
    operator_delete__(dst);
    local_68 = 0xaaaaaaaaaaaaaaaa;
    encoding = -0x55555556;
    uStack_74 = 0xaaaaaaaa;
    uStack_70 = 0xaaaaaaaa;
    uStack_6c = 0xaaaaaaaa;
    iVar6 = 0;
    QImage::createAlphaMask(local_90,&this->cursor,0);
    QImage::convertToFormat((QImage *)&encoding,(Format)local_90,(ImageConversionFlags)0x1);
    QImage::~QImage(local_90);
    QImage::width();
    while( true ) {
      iVar5 = QImage::height();
      if (iVar5 <= iVar6) break;
      lVar8 = QImage::scanLine((int)(QImage *)&encoding);
      QIODevice::write((char *)pQVar7,lVar8);
      iVar6 = iVar6 + 1;
    }
    QImage::~QImage((QImage *)&encoding);
    QImage::~QImage((QImage *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QVncClientCursor::write(QVncClient *client) const
{
    QTcpSocket *socket = client->clientSocket();

    // FramebufferUpdate header
    {
        const quint16 tmp[6] = { htons(0),
                                 htons(1),
                                 htons(static_cast<uint16_t>(hotspot.x())), htons(static_cast<uint16_t>(hotspot.y())),
                                 htons(static_cast<uint16_t>(cursor.width())),
                                 htons(static_cast<uint16_t>(cursor.height())) };
        socket->write(reinterpret_cast<const char*>(tmp), sizeof(tmp));

        const qint32 encoding = qToBigEndian(-239);
        socket->write(reinterpret_cast<const char*>(&encoding), sizeof(encoding));
    }

    if (cursor.isNull())
        return;

    // write pixels
    Q_ASSERT(cursor.hasAlphaChannel());
    const QImage img = cursor.convertToFormat(client->server()->screen()->format());
    const int n = client->clientBytesPerPixel() * img.width();
    const int depth = img.depth();
    char *buffer = new char[n];
    for (int i = 0; i < img.height(); ++i) {
        client->convertPixels(buffer, (const char*)img.scanLine(i), img.width(), depth);
        socket->write(buffer, n);
    }
    delete[] buffer;

    // write mask
    const QImage bitmap = cursor.createAlphaMask().convertToFormat(QImage::Format_Mono);
    Q_ASSERT(bitmap.depth() == 1);
    Q_ASSERT(bitmap.size() == img.size());
    const int width = (bitmap.width() + 7) / 8;
    for (int i = 0; i < bitmap.height(); ++i)
        socket->write(reinterpret_cast<const char*>(bitmap.scanLine(i)), width);
}